

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_4U>::getUNORMPacked
          (ImageT<unsigned_char,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  uint uVar1;
  uchar *puVar2;
  int in_ECX;
  int in_EDX;
  anon_class_72_9_1f7fd2b6 *in_RSI;
  allocator_type *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar3;
  uint64_t pack_3;
  uint32_t pack_2;
  uint16_t pack_1;
  uint8_t pack;
  anon_class_72_9_1f7fd2b6 copy;
  uchar *target;
  Color *pixel;
  uint32_t x;
  uint32_t y;
  uint32_t sourceBits;
  uint numChannels;
  bool packC3;
  bool packC2;
  bool packC1;
  bool packC0;
  uint32_t targetPackBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  allocator_type *pack_00;
  uint local_4c;
  uint local_48;
  
  if ((in_EDX + in_ECX + in_R8D + in_R9D & 7U) != 0) {
    __assert_fail("(c0 + c1 + c2 + c3) % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x347,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  uVar1 = (uint)(in_EDX + in_ECX + in_R8D + in_R9D) >> 3;
  bVar3 = true;
  if (((uVar1 != 1) && (bVar3 = true, uVar1 != 2)) && (bVar3 = true, uVar1 != 4)) {
    bVar3 = uVar1 == 8;
  }
  if (bVar3) {
    if (4 < (byte)((in_EDX != 0) + (in_ECX != 0) + (in_R8D != 0) + (in_R9D != 0))) {
      __assert_fail("numChannels <= componentCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                    ,0x34f,
                    "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                   );
    }
    pack_00 = in_RDI;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1fa143);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,(size_type)pack_00,
               in_RDI);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1fa165);
    for (local_48 = 0; local_48 < *(uint *)((long)&in_RSI->pixel + 4); local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < *(uint *)&in_RSI->pixel; local_4c = local_4c + 1) {
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1fa1db);
        puVar2 = puVar2 + (local_48 * *(int *)&in_RSI->pixel + local_4c) * uVar1;
        if (uVar1 == 1) {
          const::{lambda(auto:1&)#1}::operator()(in_RSI,(uchar *)pack_00);
          *puVar2 = '\0';
        }
        else if (uVar1 == 2) {
          const::{lambda(auto:1&)#1}::operator()(in_RSI,(unsigned_short *)pack_00);
          puVar2[0] = '\0';
          puVar2[1] = '\0';
        }
        else if (uVar1 == 4) {
          const::{lambda(auto:1&)#1}::operator()(in_RSI,(uint *)pack_00);
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
        }
        else if (uVar1 == 8) {
          const::{lambda(auto:1&)#1}::operator()(in_RSI,(unsigned_long *)pack_00);
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
        }
      }
    }
    return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pack_00;
  }
  __assert_fail("targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x349,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUNORMPacked(
            uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert((c0 + c1 + c2 + c3) % 8 == 0);
        const auto targetPackBytes = (c0 + c1 + c2 + c3) / 8;
        assert(targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8);
        const auto packC0 = c0 > 0;
        const auto packC1 = c1 > 0;
        const auto packC2 = c2 > 0;
        const auto packC3 = c3 > 0;
        const auto numChannels = (packC0 ? 1u : 0) + (packC1 ? 1u : 0) + (packC2 ? 1u : 0) + (packC3 ? 1u : 0);
        assert(numChannels <= componentCount); (void) numChannels;
        const uint32_t sourceBits = sizeof(componentType) * 8;
        static constexpr auto hasC0 = componentCount > 0;
        static constexpr auto hasC1 = componentCount > 1;
        static constexpr auto hasC2 = componentCount > 2;
        static constexpr auto hasC3 = componentCount > 3;

        std::vector<uint8_t> data(height * width * targetPackBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * targetPackBytes;

                const auto copy = [&](auto& pack) {
                    using PackType = std::remove_reference_t<decltype(pack)>;

                    if (packC0) {
                        const auto sourceValue = hasC0 ? pixel[0] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c0);
                        pack |= static_cast<PackType>(value) << (c1 + c2 + c3);
                    }
                    if (packC1) {
                        const auto sourceValue = hasC1 ? pixel[1] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c1);
                        pack |= static_cast<PackType>(value) << (c2 + c3);
                    }
                    if (packC2) {
                        const auto sourceValue = hasC2 ? pixel[2] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c2);
                        pack |= static_cast<PackType>(value) << c3;
                    }
                    if (packC3) {
                        const auto sourceValue = hasC3 ? pixel[3] : Color::one();
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c3);
                        pack |= static_cast<PackType>(value);
                    }
                };

                if (targetPackBytes == 1) {
                    uint8_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 2) {
                    uint16_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 4) {
                    uint32_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 8) {
                    uint64_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                }
            }
        }

        return data;
    }